

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# step.cc
# Opt level: O0

VectorXd solveStep(shared_ptr<const_lf::mesh::Mesh> *mesh,DofHandler *dofh,double flowrate,
                  bool modified_penalty)

{
  __tuple_element_t<0UL,_tuple<COOMatrix<double>,_Matrix<double,__1,_1,_0,__1,_1>,_Matrix<double,__1,_1,_0,__1,_1>_>_>
  *this;
  MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *b;
  byte in_CL;
  undefined7 in_register_00000011;
  DofHandler *dofh_00;
  Index extraout_RDX;
  VectorXd VVar1;
  Solve<Eigen::SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
  local_6c0;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Solve<Eigen::SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
  local_6b0;
  undefined1 local_690 [8];
  SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_> solver;
  SparseMatrix<double,_0,_int> As;
  allocator<char> local_3c1;
  string local_3c0;
  int local_3a0 [2];
  Vector2d local_398;
  CodimMeshDataSet<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> local_380;
  allocator<char> local_341;
  string local_340;
  allocator<char> local_319;
  string local_318;
  shared_ptr<const_lf::mesh::Mesh> local_2f8;
  undefined1 local_2e8 [8];
  VtkWriter writer;
  type *offset_function;
  type *rhs;
  type *A;
  QuadRule local_e8;
  function<Eigen::Matrix<double,_2,_1,_0,_2,_1>_(const_lf::mesh::Entity_&)> local_b8;
  function<Eigen::Matrix<double,_2,_1,_0,_2,_1>_(const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_&)>
  local_98;
  tuple<lf::assemble::COOMatrix<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
  local_78;
  anon_class_8_1_60f12c8c local_38;
  anon_class_8_1_60f12c8c dirichlet_funct;
  anon_class_1_0_00000001 f;
  double dStack_28;
  bool modified_penalty_local;
  double flowrate_local;
  DofHandler *dofh_local;
  shared_ptr<const_lf::mesh::Mesh> *mesh_local;
  
  dofh_00 = (DofHandler *)CONCAT71(in_register_00000011,modified_penalty);
  dirichlet_funct.flowrate._7_1_ = in_CL & 1;
  dirichlet_funct.flowrate._6_1_ = 0;
  local_38.flowrate = &stack0xffffffffffffffd8;
  dStack_28 = flowrate;
  std::function<Eigen::Matrix<double,2,1,0,2,1>(Eigen::Matrix<double,2,1,0,2,1>const&)>::
  function<solveStep(std::shared_ptr<lf::mesh::Mesh_const>const&,lf::assemble::DofHandler_const&,double,bool)::__0&,void>
            ((function<Eigen::Matrix<double,2,1,0,2,1>(Eigen::Matrix<double,2,1,0,2,1>const&)> *)
             &local_98,(anon_class_1_0_00000001 *)((long)&dirichlet_funct.flowrate + 6));
  std::function<Eigen::Matrix<double,2,1,0,2,1>(lf::mesh::Entity_const&)>::
  function<solveStep(std::shared_ptr<lf::mesh::Mesh_const>const&,lf::assemble::DofHandler_const&,double,bool)::__1&,void>
            ((function<Eigen::Matrix<double,2,1,0,2,1>(lf::mesh::Entity_const&)> *)&local_b8,
             &local_38);
  lf::quad::make_TriaQR_MidpointRule();
  projects::ipdg_stokes::assemble::buildSystemMatrixInOutFlow
            (&local_78,(shared_ptr<const_lf::mesh::Mesh> *)dofh,dofh_00,&local_98,&local_b8,1.0,
             &local_e8,(bool)(dirichlet_funct.flowrate._7_1_ & 1));
  lf::quad::QuadRule::~QuadRule(&local_e8);
  std::function<Eigen::Matrix<double,_2,_1,_0,_2,_1>_(const_lf::mesh::Entity_&)>::~function
            (&local_b8);
  std::function<Eigen::Matrix<double,_2,_1,_0,_2,_1>_(const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_&)>
  ::~function(&local_98);
  this = std::
         get<0ul,lf::assemble::COOMatrix<double>,Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Matrix<double,_1,1,0,_1,1>>
                   (&local_78);
  b = (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
      std::
      get<1ul,lf::assemble::COOMatrix<double>,Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Matrix<double,_1,1,0,_1,1>>
                (&local_78);
  writer.aux_node_offset_._M_elems[1]._48_8_ =
       std::
       get<2ul,lf::assemble::COOMatrix<double>,Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Matrix<double,_1,1,0,_1,1>>
                 (&local_78);
  std::shared_ptr<const_lf::mesh::Mesh>::shared_ptr
            (&local_2f8,(shared_ptr<const_lf::mesh::Mesh> *)dofh);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_318,"offset_function.vtk",&local_319);
  lf::io::VtkWriter::VtkWriter((VtkWriter *)local_2e8,&local_2f8,&local_318,0,'\x01');
  std::__cxx11::string::~string((string *)&local_318);
  std::allocator<char>::~allocator(&local_319);
  std::shared_ptr<const_lf::mesh::Mesh>::~shared_ptr(&local_2f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_340,"v",&local_341);
  projects::ipdg_stokes::post_processing::extractVelocity
            (&local_380,(shared_ptr<const_lf::mesh::Mesh> *)dofh,dofh_00,
             (VectorXd *)writer.aux_node_offset_._M_elems[1]._48_8_);
  local_3a0[1] = 0;
  local_3a0[0] = 0;
  Eigen::Matrix<double,2,1,0,2,1>::Matrix<int,int>
            ((Matrix<double,2,1,0,2,1> *)&local_398,local_3a0 + 1,local_3a0);
  lf::io::VtkWriter::WriteCellData
            ((VtkWriter *)local_2e8,&local_340,
             &local_380.super_MeshDataSet<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>,&local_398);
  lf::mesh::utils::CodimMeshDataSet<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>::~CodimMeshDataSet
            (&local_380);
  std::__cxx11::string::~string((string *)&local_340);
  std::allocator<char>::~allocator(&local_341);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3c0,"c",&local_3c1);
  projects::ipdg_stokes::post_processing::extractBasisFunctionCoefficients
            ((CodimMeshDataSet<double> *)&As.m_data.m_allocatedSize,
             (shared_ptr<const_lf::mesh::Mesh> *)dofh,dofh_00,
             (VectorXd *)writer.aux_node_offset_._M_elems[1]._48_8_);
  lf::io::VtkWriter::WritePointData
            ((VtkWriter *)local_2e8,&local_3c0,(MeshDataSet<double> *)&As.m_data.m_allocatedSize,0.0
            );
  lf::mesh::utils::CodimMeshDataSet<double>::~CodimMeshDataSet
            ((CodimMeshDataSet<double> *)&As.m_data.m_allocatedSize);
  std::__cxx11::string::~string((string *)&local_3c0);
  std::allocator<char>::~allocator(&local_3c1);
  lf::assemble::COOMatrix<double>::makeSparse
            ((SparseMatrix<double,_0,_int> *)&solver.m_detPermC,this);
  Eigen::SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_>::SparseLU
            ((SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_> *)local_690
            );
  Eigen::SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_>::compute
            ((SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_> *)local_690
             ,(MatrixType *)&solver.m_detPermC);
  local_6c0 = Eigen::
              SparseSolverBase<Eigen::SparseLU<Eigen::SparseMatrix<double,0,int>,Eigen::COLAMDOrdering<int>>>
              ::solve<Eigen::Matrix<double,_1,1,0,_1,1>>
                        ((SparseSolverBase<Eigen::SparseLU<Eigen::SparseMatrix<double,0,int>,Eigen::COLAMDOrdering<int>>>
                          *)local_690,b);
  Eigen::
  MatrixBase<Eigen::Solve<Eigen::SparseLU<Eigen::SparseMatrix<double,0,int>,Eigen::COLAMDOrdering<int>>,Eigen::Matrix<double,-1,1,0,-1,1>>>
  ::operator+(&local_6b0,
              (MatrixBase<Eigen::Solve<Eigen::SparseLU<Eigen::SparseMatrix<double,0,int>,Eigen::COLAMDOrdering<int>>,Eigen::Matrix<double,_1,1,0,_1,1>>>
               *)&local_6c0,
              (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
              writer.aux_node_offset_._M_elems[1]._48_8_);
  Eigen::Matrix<double,-1,1,0,-1,1>::
  Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Solve<Eigen::SparseLU<Eigen::SparseMatrix<double,0,int>,Eigen::COLAMDOrdering<int>>,Eigen::Matrix<double,_1,1,0,_1,1>>const,Eigen::Matrix<double,_1,1,0,_1,1>const>>
            ((Matrix<double,_1,1,0,_1,1> *)mesh,
             (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Solve<Eigen::SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              *)&local_6b0);
  Eigen::SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_>::~SparseLU
            ((SparseLU<Eigen::SparseMatrix<double,_0,_int>,_Eigen::COLAMDOrdering<int>_> *)local_690
            );
  Eigen::SparseMatrix<double,_0,_int>::~SparseMatrix
            ((SparseMatrix<double,_0,_int> *)&solver.m_detPermC);
  lf::io::VtkWriter::~VtkWriter((VtkWriter *)local_2e8);
  std::
  tuple<lf::assemble::COOMatrix<double>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>
  ::~tuple(&local_78);
  VVar1.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
       extraout_RDX;
  VVar1.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)mesh;
  return (VectorXd)VVar1.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage;
}

Assistant:

Eigen::VectorXd solveStep(const std::shared_ptr<const lf::mesh::Mesh> &mesh,
                          const lf::assemble::DofHandler &dofh, double flowrate,
                          bool modified_penalty) {
  // No volume forces are present
  auto f = [](const Eigen::Vector2d & /*unused*/) -> Eigen::Vector2d {
    return Eigen::Vector2d::Zero();
  };
  // Enforce a Poiseuille in- and outflow and no-slip boundary conditions at the
  // tube boundaries
  auto dirichlet_funct = [&](const lf::mesh::Entity &edge) -> Eigen::Vector2d {
    static constexpr double eps = 1e-10;
    const auto *const geom = edge.Geometry();
    const auto vertices = geom->Global(edge.RefEl().NodeCoords());
    const Eigen::Vector2d midpoint = vertices.rowwise().sum() / 2;
    Eigen::Vector2d v;
    if (vertices(0, 0) >= -3 - eps && vertices(0, 0) <= -3 + eps &&
        vertices(0, 1) >= -3 - eps && vertices(0, 1) <= -3 + eps) {
      // The edge is part of the inflow boundary
      v << poiseuilleVelocity(0.5, flowrate, midpoint[1] - 0.5), 0;
      return v;
    }
    if (vertices(0, 0) >= 3 - eps && vertices(0, 0) <= 3 + eps &&
        vertices(0, 1) >= 3 - eps && vertices(0, 1) <= 3 + eps) {
      // The edge is part of the outflow boundary
      v << poiseuilleVelocity(1, flowrate, midpoint[1]), 0;
      return v;
    }
    return Eigen::Vector2d::Zero();
  };

  // Solve the system using sparse LU
  const auto [A, rhs, offset_function] =
      projects::ipdg_stokes::assemble::buildSystemMatrixInOutFlow(
          mesh, dofh, f, dirichlet_funct, 1,
          lf::quad::make_TriaQR_MidpointRule(), modified_penalty);
  lf::io::VtkWriter writer(mesh, "offset_function.vtk");
  writer.WriteCellData("v",
                       projects::ipdg_stokes::post_processing::extractVelocity(
                           mesh, dofh, offset_function));
  writer.WritePointData(
      "c",
      projects::ipdg_stokes::post_processing::extractBasisFunctionCoefficients(
          mesh, dofh, offset_function));
  auto As = A.makeSparse();
  Eigen::SparseLU<Eigen::SparseMatrix<double>> solver;
  solver.compute(As);
  return solver.solve(rhs) + offset_function;
}